

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O0

uint32_t WriteBinaryMaterial(aiMaterial *mat)

{
  uint32_t ofs;
  uint32_t uVar1;
  uint local_1c;
  uint i;
  uint32_t old;
  uint32_t len;
  aiMaterial *mat_local;
  
  ofs = WriteMagic(0x123d);
  i = Write<unsigned_int>(&mat->mNumProperties);
  for (local_1c = 0; local_1c < mat->mNumProperties; local_1c = local_1c + 1) {
    uVar1 = WriteBinaryMaterialProperty(mat->mProperties[local_1c]);
    i = uVar1 + 8 + i;
  }
  ChangeInteger(ofs,i);
  return i;
}

Assistant:

uint32_t WriteBinaryMaterial(const aiMaterial* mat)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AIMATERIAL);

	len += Write<unsigned int>(mat->mNumProperties);
	for (unsigned int i = 0; i < mat->mNumProperties;++i) {
		len += WriteBinaryMaterialProperty(mat->mProperties[i])+8;
	}

	ChangeInteger(old,len);
	return len;
}